

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O3

UINT16 TPMS_TAGGED_PCR_SELECT_Marshal(TPMS_TAGGED_PCR_SELECT *source,BYTE **buffer,INT32 *size)

{
  int iVar1;
  int iVar2;
  byte bVar3;
  uint uVar4;
  BYTE *__dest;
  
  UINT32_Marshal(&source->tag,buffer,size);
  if (buffer == (BYTE **)0x0) {
    uVar4 = (uint)source->sizeofSelect;
  }
  else {
    if (size == (INT32 *)0x0) {
      uVar4 = (uint)source->sizeofSelect;
      **buffer = source->sizeofSelect;
      __dest = *buffer + 1;
      *buffer = __dest;
    }
    else {
      iVar1 = *size;
      iVar2 = iVar1 + -1;
      *size = iVar2;
      if (iVar1 < 1) {
        bVar3 = source->sizeofSelect;
      }
      else {
        bVar3 = source->sizeofSelect;
        **buffer = bVar3;
        *buffer = *buffer + 1;
        iVar2 = *size;
      }
      uVar4 = (uint)bVar3;
      *size = iVar2 - (uint)bVar3;
      if ((int)(iVar2 - (uint)bVar3) < 0) goto LAB_00105acf;
      __dest = *buffer;
    }
    memcpy(__dest,source->pcrSelect,(ulong)uVar4);
    *buffer = *buffer + uVar4;
  }
LAB_00105acf:
  return (short)uVar4 + 5;
}

Assistant:

UINT16
TPMS_TAGGED_PCR_SELECT_Marshal(TPMS_TAGGED_PCR_SELECT *source, BYTE **buffer, INT32 *size)
{
    UINT16    result = 0;
    result = (UINT16)(result + TPM_PT_PCR_Marshal((TPM_PT_PCR *)&(source->tag), buffer, size));
    result = (UINT16)(result + UINT8_Marshal((UINT8 *)&(source->sizeofSelect), buffer, size));
    result = (UINT16)(result + BYTE_Array_Marshal((BYTE *)(source->pcrSelect), buffer, size, (INT32)(source->sizeofSelect)));
    return result;
}